

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

Type convertToExtendedType(QCborContainerPrivate *d)

{
  long lVar1;
  QCborContainerPrivate *pQVar2;
  QDateTime QVar3;
  enable_if_t<std::is_integral_v<long_long>,_bool> eVar4;
  bool bVar5;
  pointer pEVar6;
  pointer pEVar7;
  ulong uVar8;
  Type TVar9;
  undefined1 in_SIL;
  long msecs;
  char *pcVar10;
  ByteData *this;
  long in_FS_OFFSET;
  double v;
  QLatin1StringView latin1;
  Data local_98 [3];
  Data local_80;
  QDateTime dt;
  anon_class_16_2_94731e6a local_70;
  QCborContainerPrivate *d_local;
  char buf [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (((d->elements).d.ptr)->field_0).container;
  d_local = d;
  pEVar6 = QList<QtCbor::Element>::data(&d->elements);
  pEVar7 = pEVar6 + 1;
  pcVar10 = (d->data).d.ptr;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = &QByteArray::_empty;
  }
  uVar8._0_4_ = pEVar6[1].type;
  uVar8._4_4_ = pEVar6[1].flags;
  this = (ByteData *)(pcVar10 + pEVar6[1].field_0.value);
  local_70.d = &d_local;
  local_70.e = pEVar7;
  if (pQVar2 < (QCborContainerPrivate *)0x2) {
    dt.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
    QDateTime::QDateTime(&dt);
    TVar9 = pEVar6[1].type;
    if ((TVar9 == String & (byte)((uint)uVar8._4_4_ >> 1) & 1 &
        pQVar2 == (QCborContainerPrivate *)0x0) == 1) {
      if ((pEVar6[1].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
           super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 4) == 0) {
        latin1.m_data = (char *)(this + 1);
        latin1.m_size = this->len;
        QString::QString((QString *)buf,latin1);
        QDateTime::fromString((QString *)&local_98[0].data,(DateFormat)buf);
        QVar3 = dt;
        dt.d = (Data)(Data)local_98[0].data;
        local_98[0] = QVar3.d;
        QDateTime::~QDateTime((QDateTime *)&local_98[0].data);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buf);
      }
    }
    else if (pQVar2 == (QCborContainerPrivate *)0x1) {
      buf._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      if (TVar9 == Double) {
        v = round((double)pEVar7->field_0 * 1000.0);
        eVar4 = anon_unknown.dwarf_98797d::convertDoubleTo<long_long>
                          (v,(longlong *)buf,(bool)in_SIL);
        msecs = buf._0_8_;
        if (eVar4) goto LAB_002b5f12;
      }
      else if ((TVar9 == Integer) &&
              (msecs = (pEVar7->field_0).value * 1000,
              SEXT816(msecs) == SEXT816((pEVar7->field_0).value) * SEXT416(1000))) {
LAB_002b5f12:
        local_80 = (Data)0x2;
        QDateTime::fromMSecsSinceEpoch
                  ((QDateTime *)&local_98[0].data,msecs,(QTimeZone *)&local_80.s);
        QVar3 = dt;
        dt.d = (Data)(Data)local_98[0].data;
        local_98[0] = QVar3.d;
        QDateTime::~QDateTime((QDateTime *)&local_98[0].data);
        QTimeZone::~QTimeZone((QTimeZone *)&local_80.s);
      }
    }
    bVar5 = QDateTime::isValid(&dt);
    if (bVar5) {
      buf._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      buf._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::toString((QString *)&local_98[0].data,&dt,ISODateWithMs);
      QString::toLatin1_helper_inplace((QByteArray *)buf,(QString *)&local_98[0].data);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&local_98[0].data);
      pcVar10 = (char *)buf._8_8_;
      if (buf._8_8_ == 0) {
        pcVar10 = &QByteArray::_empty;
      }
      convertToExtendedType::anon_class_16_2_94731e6a::operator()
                (&local_70,pcVar10,-0x5555555555555556,(ValueFlags)0x8);
      pEVar6[1].type = String;
      pEVar7 = QList<QtCbor::Element>::data(&d_local->elements);
      (pEVar7->field_0).value = 0;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buf);
      QDateTime::~QDateTime(&dt);
      TVar9 = DateTime;
      goto LAB_002b6007;
    }
    QDateTime::~QDateTime(&dt);
  }
  else if (pQVar2 == (QCborContainerPrivate *)0x20) {
    if ((undefined4)uVar8 == 0x60) {
      TVar9 = Url;
      if ((uVar8 >> 0x21 & 1) != 0) {
        dt.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
        if ((uVar8 >> 0x22 & 1) == 0) {
          QtCbor::ByteData::toUtf8String((QString *)buf,this);
        }
        else {
          QtCbor::ByteData::asQStringRaw((QString *)buf,this);
        }
        QUrl::QUrl((QUrl *)&dt,(QString *)buf,StrictMode);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buf);
        bVar5 = QUrl::isValid((QUrl *)&dt);
        if (bVar5) {
          buf._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          buf._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QUrl::toString((QString *)&local_98[0].data,(QUrl *)&dt,(FormattingOptions)0x2000000);
          QString::toUtf8_helper((QByteArray *)buf,(QString *)&local_98[0].data);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&local_98[0].data);
          pcVar10 = (char *)buf._8_8_;
          if (buf._8_8_ == 0) {
            pcVar10 = &QByteArray::_empty;
          }
          convertToExtendedType::anon_class_16_2_94731e6a::operator()
                    (&local_70,pcVar10,-0x5555555555555556,(ValueFlags)0x0);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buf);
        }
        QUrl::~QUrl((QUrl *)&dt);
      }
      goto LAB_002b6007;
    }
  }
  else if (pQVar2 == (QCborContainerPrivate *)0x23) {
    TVar9 = RegularExpression;
    if ((undefined4)uVar8 == 0x60) goto LAB_002b6007;
  }
  else if ((pQVar2 == (QCborContainerPrivate *)0x25) && ((undefined4)uVar8 == 0x40)) {
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    if ((uVar8 >> 0x21 & 1) != 0) {
      uVar8 = this->len;
      if (0xf < (ulong)this->len) {
        uVar8 = 0x10;
      }
      __memcpy_chk(buf,this + 1,uVar8);
    }
    convertToExtendedType::anon_class_16_2_94731e6a::operator()(&local_70,buf,0x10,(ValueFlags)0x0);
    TVar9 = Uuid;
    goto LAB_002b6007;
  }
  TVar9 = Tag;
LAB_002b6007:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return TVar9;
  }
  __stack_chk_fail();
}

Assistant:

static QCborValue::Type convertToExtendedType(QCborContainerPrivate *d)
{
    qint64 tag = d->elements.at(0).value;
    auto &e = d->elements[1];
    const ByteData *b = d->byteData(e);

    auto replaceByteData = [&](const char *buf, qsizetype len, Element::ValueFlags f) {
        d->data.clear();
        d->usedData = 0;
        e.flags = Element::HasByteData | f;
        e.value = d->addByteData(buf, len);
    };

    switch (tag) {
#if QT_CONFIG(datestring)
    case qint64(QCborKnownTags::DateTimeString):
    case qint64(QCborKnownTags::UnixTime_t): {
        QDateTime dt;
        if (tag == qint64(QCborKnownTags::DateTimeString) && b &&
            e.type == QCborValue::String && (e.flags & Element::StringIsUtf16) == 0) {
            // The data is supposed to be US-ASCII. If it isn't (contains UTF-8),
            // QDateTime::fromString will fail anyway.
            dt = QDateTime::fromString(b->asLatin1(), Qt::ISODateWithMs);
        } else if (tag == qint64(QCborKnownTags::UnixTime_t)) {
            qint64 msecs;
            bool ok = false;
            if (e.type == QCborValue::Integer) {
#if QT_POINTER_SIZE == 8
                // we don't have a fast 64-bit qMulOverflow implementation on
                // 32-bit architectures.
                ok = !qMulOverflow(e.value, qint64(1000), &msecs);
#else
                static const qint64 Limit = std::numeric_limits<qint64>::max() / 1000;
                ok = (e.value > -Limit && e.value < Limit);
                if (ok)
                    msecs = e.value * 1000;
#endif
            } else if (e.type == QCborValue::Double) {
                ok = convertDoubleTo(round(e.fpvalue() * 1000), &msecs);
            }
            if (ok)
                dt = QDateTime::fromMSecsSinceEpoch(msecs, QTimeZone::UTC);
        }
        if (dt.isValid()) {
            QByteArray text = dt.toString(Qt::ISODateWithMs).toLatin1();
            if (!text.isEmpty()) {
                replaceByteData(text, text.size(), Element::StringIsAscii);
                e.type = QCborValue::String;
                d->elements[0].value = qint64(QCborKnownTags::DateTimeString);
                return QCborValue::DateTime;
            }
        }
        break;
    }
#endif

#ifndef QT_BOOTSTRAPPED
    case qint64(QCborKnownTags::Url):
        if (e.type == QCborValue::String) {
            if (b) {
                // normalize to a short (decoded) form, so as to save space
                QUrl url(e.flags & Element::StringIsUtf16 ?
                             b->asQStringRaw() :
                             b->toUtf8String(), QUrl::StrictMode);
                if (url.isValid()) {
                    QByteArray encoded = url.toString(QUrl::DecodeReserved).toUtf8();
                    replaceByteData(encoded, encoded.size(), {});
                }
            }
            return QCborValue::Url;
        }
        break;
#endif // QT_BOOTSTRAPPED

#if QT_CONFIG(regularexpression)
    case quint64(QCborKnownTags::RegularExpression):
        if (e.type == QCborValue::String) {
            // no normalization is necessary
            return QCborValue::RegularExpression;
        }
        break;
#endif // QT_CONFIG(regularexpression)

    case qint64(QCborKnownTags::Uuid):
        if (e.type == QCborValue::ByteArray) {
            // force the size to 16
            char buf[sizeof(QUuid)] = {};
            if (b)
                memcpy(buf, b->byte(), qMin(sizeof(buf), size_t(b->len)));
            replaceByteData(buf, sizeof(buf), {});

            return QCborValue::Uuid;
        }
        break;
    }

    // no enriching happened
    return QCborValue::Tag;
}